

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envyas.c
# Opt level: O3

void extend(section *s,int add)

{
  uint8_t *__ptr;
  int iVar1;
  int iVar2;
  
  iVar1 = s->maxpos;
  if (iVar1 <= s->pos + add) {
    __ptr = s->code;
    do {
      iVar2 = iVar1 * 2;
      if (iVar1 == 0) {
        iVar2 = 0x100;
      }
      s->maxpos = iVar2;
      __ptr = (uint8_t *)realloc(__ptr,(long)iVar2);
      s->code = __ptr;
      iVar1 = s->maxpos;
    } while (iVar1 <= s->pos + add);
  }
  return;
}

Assistant:

void extend(struct section *s, int add) {
	while (s->pos + add >= s->maxpos) {
		if (!s->maxpos)
			s->maxpos = 256;
		else
			s->maxpos *= 2;
		s->code = realloc (s->code, s->maxpos);
	}
}